

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

void __thiscall
Imf_3_4::CompressedIDManifest::CompressedIDManifest(CompressedIDManifest *this,IDManifest *manifest)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  InputExc *this_00;
  undefined4 *in_RDI;
  size_t compressedDataSize;
  size_t compressedBufferSize;
  size_t outputSize;
  vector<char,_std::allocator<char>_> serial;
  vector<char,_std::allocator<char>_> *in_stack_000004c8;
  IDManifest *in_stack_000004d0;
  undefined4 in_stack_ffffffffffffff90;
  size_t local_50;
  size_t local_48;
  size_type local_40;
  vector<char,_std::allocator<char>_> local_28;
  
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1e6940);
  IDManifest::serialize(in_stack_000004d0,in_stack_000004c8);
  local_40 = std::vector<char,_std::allocator<char>_>::size(&local_28);
  local_48 = exr_compress_max_buffer_size(local_40);
  pvVar2 = malloc(local_48);
  *(void **)(in_RDI + 4) = pvVar2;
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1e699b);
  iVar1 = exr_compress_buffer(0,0xffffffff,pcVar3,local_40,*(undefined8 *)(in_RDI + 4),local_48,
                              &local_50);
  if (iVar1 != 0) {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(this_00,"ID manifest compression failed");
    __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  pvVar2 = realloc(*(void **)(in_RDI + 4),local_50);
  *(void **)(in_RDI + 4) = pvVar2;
  *(size_type *)(in_RDI + 2) = local_40;
  *in_RDI = (int)local_50;
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)CONCAT44(iVar1,in_stack_ffffffffffffff90));
  return;
}

Assistant:

CompressedIDManifest::CompressedIDManifest (const IDManifest& manifest)
{
    //
    // make a compressed copy of the manifest by serializing the data into contiguous memory,
    // then calling zlib to compress
    //

    std::vector<char> serial;

    manifest.serialize (serial);

    size_t outputSize = serial.size ();

    //
    // allocate a buffer which is guaranteed to be big enough for compression
    //
    size_t compressedBufferSize = exr_compress_max_buffer_size (outputSize);
    size_t compressedDataSize;
    _data = (unsigned char*) malloc (compressedBufferSize);
    if (EXR_ERR_SUCCESS != exr_compress_buffer (
                               nullptr,
                               -1,
                               serial.data (),
                               outputSize,
                               _data,
                               compressedBufferSize,
                               &compressedDataSize))
    {
        throw IEX_NAMESPACE::InputExc ("ID manifest compression failed");
    }

    // now call realloc to reallocate the buffer to a smaller size - this might free up memory
    _data = (unsigned char*) realloc (_data, compressedDataSize);

    _uncompressedDataSize = outputSize;
    _compressedDataSize   = compressedDataSize;
}